

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O3

size_t mpack_expect_enum(mpack_reader_t *reader,char **strings,size_t count)

{
  char *__s;
  uint32_t uVar1;
  int iVar2;
  char *__s1;
  size_t sVar3;
  size_t sVar4;
  ulong count_00;
  
  uVar1 = mpack_expect_str(reader);
  count_00 = (ulong)uVar1;
  __s1 = mpack_read_bytes_inplace_notrack(reader,count_00);
  if (reader->error == mpack_ok) {
    if (count != 0) {
      sVar4 = 0;
      do {
        __s = strings[sVar4];
        sVar3 = strlen(__s);
        if ((sVar3 == count_00) && (iVar2 = bcmp(__s1,__s,count_00), iVar2 == 0)) {
          return sVar4;
        }
        sVar4 = sVar4 + 1;
      } while (count != sVar4);
    }
    reader->error = mpack_error_type;
    reader->end = reader->data;
    if (reader->error_fn != (mpack_reader_error_t)0x0) {
      (*reader->error_fn)(reader,mpack_error_type);
    }
  }
  return count;
}

Assistant:

size_t mpack_expect_enum(mpack_reader_t* reader, const char* strings[], size_t count) {

    // read the string in-place
    size_t keylen = mpack_expect_str(reader);
    const char* key = mpack_read_bytes_inplace(reader, keylen);
    mpack_done_str(reader);
    if (mpack_reader_error(reader) != mpack_ok)
        return count;

    // find what key it matches
    for (size_t i = 0; i < count; ++i) {
        const char* other = strings[i];
        size_t otherlen = mpack_strlen(other);
        if (keylen == otherlen && mpack_memcmp(key, other, keylen) == 0)
            return i;
    }

    // no matches
    mpack_reader_flag_error(reader, mpack_error_type);
    return count;
}